

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_str_split(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  char *zString;
  jx9_value *pjVar2;
  jx9_value *pVal;
  char *pcVar3;
  char *pcVar4;
  int nLen_00;
  int iVar5;
  bool bVar6;
  int nLen;
  int local_3c;
  jx9_context *local_38;
  
  if ((0 < nArg) && (zString = jx9_value_to_string(*apArg,&local_3c), 0 < local_3c)) {
    iVar5 = 1;
    if (nArg != 1) {
      pjVar2 = apArg[1];
      jx9MemObjToInteger(pjVar2);
      iVar5 = *(int *)&pjVar2->x;
      if (iVar5 < 1) goto LAB_001329b9;
      if (local_3c < iVar5) {
        iVar5 = local_3c;
      }
    }
    pjVar2 = jx9_context_new_array(pCtx);
    pVal = jx9_context_new_scalar(pCtx);
    if (pjVar2 != (jx9_value *)0x0 && pVal != (jx9_value *)0x0) {
      pcVar4 = zString + local_3c;
      local_38 = pCtx;
      do {
        pcVar3 = zString;
        if (zString < pcVar4) {
          nLen_00 = (int)pcVar4 - (int)zString;
          if (iVar5 < nLen_00) {
            nLen_00 = iVar5;
          }
          jx9_value_string(pVal,zString,nLen_00);
          if ((pjVar2->iFlags & 0x40) != 0) {
            HashmapInsert((jx9_hashmap *)(pjVar2->x).pOther,(jx9_value *)0x0,pVal);
          }
          (pVal->sBlob).nByte = 0;
          uVar1 = (pVal->sBlob).nFlags;
          if ((uVar1 & 4) != 0) {
            (pVal->sBlob).pBlob = (void *)0x0;
            (pVal->sBlob).mByte = 0;
            (pVal->sBlob).nFlags = uVar1 & 0xfffffffb;
          }
          pcVar3 = zString + nLen_00;
          iVar5 = nLen_00;
        }
        bVar6 = zString < pcVar4;
        zString = pcVar3;
      } while (bVar6);
      jx9_result_value(local_38,pjVar2);
      return 0;
    }
  }
LAB_001329b9:
  pjVar2 = pCtx->pRet;
  jx9MemObjRelease(pjVar2);
  (pjVar2->x).rVal = 0.0;
  pjVar2->iFlags = pjVar2->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_str_split(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zEnd;
	jx9_value *pArray, *pValue;
	int split_len;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target string */
	zString = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Nothing to process, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	split_len = (int)sizeof(char);
	if( nArg > 1 ){
		/* Split length */
		split_len = jx9_value_to_int(apArg[1]);
		if( split_len < 1 ){
			/* Invalid length, return FALSE */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		if( split_len > nLen ){
			split_len = nLen;
		}
	}
	/* Create the array and the scalar value */
	pArray = jx9_context_new_array(pCtx);
	/*Chunk value */
	pValue = jx9_context_new_scalar(pCtx);
	if( pValue == 0 || pArray == 0 ){
		/* Return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the end of the string */
	zEnd = &zString[nLen];
	/* Perform the requested operation */
	for(;;){
		int nMax;
		if( zString >= zEnd ){
			/* No more input to process */
			break;
		}
		nMax = (int)(zEnd-zString);
		if( nMax < split_len ){
			split_len = nMax;
		}
		/* Copy the current chunk */
		jx9_value_string(pValue, zString, split_len);
		/* Insert it */
		jx9_array_add_elem(pArray, 0, pValue); /* Will make it's own copy */
		/* reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		/* Update position */
		zString += split_len;
	}
	/* 
	 * Return the array.
	 * Don't worry about freeing memory, everything will be automatically released
	 * upon we return from this function.
	 */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}